

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_InitStepMem
              (ARKodeMem ark_mem,ARKodeSplittingStepMem step_mem,SUNStepper_conflict *steppers,
              int partitions)

{
  size_t __size;
  SUNStepper_conflict *__dest;
  long *plVar1;
  int iVar2;
  
  free(step_mem->steppers);
  __size = (long)partitions * 8;
  __dest = (SUNStepper_conflict *)malloc(__size);
  step_mem->steppers = __dest;
  if (__dest == (SUNStepper_conflict *)0x0) {
    iVar2 = -0x14;
    arkProcessError(ark_mem,-0x14,0x218,"splittingStep_InitStepMem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Allocation of arkode_mem failed.");
  }
  else {
    memcpy(__dest,steppers,__size);
    free(step_mem->n_stepper_evolves);
    plVar1 = (long *)calloc((long)partitions,8);
    step_mem->n_stepper_evolves = plVar1;
    if (step_mem->partitions != partitions) {
      SplittingStepCoefficients_Destroy(&step_mem->coefficients);
    }
    step_mem->partitions = partitions;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int splittingStep_InitStepMem(ARKodeMem ark_mem,
                                     ARKodeSplittingStepMem step_mem,
                                     SUNStepper* steppers, int partitions)
{
  if (step_mem->steppers != NULL) { free(step_mem->steppers); }
  step_mem->steppers = malloc(partitions * sizeof(*steppers));
  if (step_mem->steppers == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return ARK_MEM_FAIL;
  }
  memcpy(step_mem->steppers, steppers, partitions * sizeof(*steppers));

  if (step_mem->n_stepper_evolves != NULL)
  {
    free(step_mem->n_stepper_evolves);
  }
  step_mem->n_stepper_evolves = calloc(partitions,
                                       sizeof(*step_mem->n_stepper_evolves));

  /* If the number of partitions changed, the coefficients are no longer
   * compatible and must be cleared. If a user previously called ARKodeSetOrder
   * that will still be respected at the next call to ARKodeEvolve */
  if (step_mem->partitions != partitions)
  {
    SplittingStepCoefficients_Destroy(&step_mem->coefficients);
  }
  step_mem->partitions = partitions;

  return ARK_SUCCESS;
}